

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FSDist_COF.cpp
# Opt level: O2

double __thiscall
FSDist_COF::GetProbability
          (FSDist_COF *this,Scope *sfSc,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sfacValues)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  const_reference pvVar4;
  const_reference this_00;
  const_reference pvVar5;
  ulong __n;
  double dVar6;
  
  dVar6 = 1.0;
  uVar3 = 0;
  while( true ) {
    __n = (ulong)uVar3;
    if ((ulong)((long)(sfSc->super_SDT).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(sfSc->super_SDT).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= __n) break;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(&sfSc->super_SDT,__n);
    uVar1 = *pvVar4;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(sfacValues,__n);
    uVar2 = *pvVar4;
    this_00 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::at(&this->_m_probs,(ulong)uVar1);
    pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_00,(ulong)uVar2);
    dVar6 = dVar6 * *pvVar5;
    uVar3 = uVar3 + 1;
  }
  return dVar6;
}

Assistant:

double FSDist_COF::GetProbability(const Scope& sfSc,
                                  const std::vector<Index>& sfacValues) const
{
    double p = 1.0;
    for(Index i=0; i < sfSc.size(); i++)
    {
        Index sfI = sfSc.at(i);
        Index sfValI_sfI = sfacValues.at(i);
        double p_this_sf = _m_probs.at(sfI).at(sfValI_sfI);
        p *= p_this_sf;
    }
    
    return p;
}